

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O1

Vec_Vec_t * Aig_ManLevelize(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  uint *puVar4;
  long lVar5;
  Vec_Vec_t *pVVar6;
  void **ppvVar7;
  undefined8 *puVar8;
  void **ppvVar9;
  void *pvVar10;
  long lVar11;
  Vec_Ptr_t *pVVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  
  lVar5 = (long)p->vCos->nSize;
  if (lVar5 < 1) {
    uVar15 = 0;
  }
  else {
    lVar11 = 0;
    uVar15 = 0;
    do {
      uVar13 = *(uint *)((*(ulong *)((long)p->vCos->pArray[lVar11] + 8) & 0xfffffffffffffffe) + 0x1c
                        );
      if (uVar15 <= (uVar13 & 0xffffff)) {
        uVar15 = uVar13 & 0xffffff;
      }
      lVar11 = lVar11 + 1;
    } while (lVar5 != lVar11);
  }
  uVar13 = uVar15 + 1;
  pVVar6 = (Vec_Vec_t *)malloc(0x10);
  uVar14 = 8;
  if (8 < uVar13) {
    uVar14 = (ulong)uVar13;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = (int)uVar14;
  ppvVar7 = (void **)malloc(uVar14 << 3);
  pVVar6->pArray = ppvVar7;
  uVar14 = 0;
  do {
    puVar8 = (undefined8 *)malloc(0x10);
    *puVar8 = 0;
    puVar8[1] = 0;
    ppvVar7[uVar14] = puVar8;
    uVar14 = uVar14 + 1;
  } while (uVar13 != uVar14);
  pVVar6->nSize = uVar13;
  pVVar12 = p->vObjs;
  if (0 < pVVar12->nSize) {
    lVar5 = 0;
    do {
      pvVar3 = pVVar12->pArray[lVar5];
      if (pvVar3 != (void *)0x0) {
        uVar13 = (uint)((ulong)*(undefined8 *)((long)pvVar3 + 0x18) >> 0x20);
        uVar16 = uVar13 & 0xffffff;
        if (uVar15 < uVar16) {
          __assert_fail("(int)pObj->Level <= nLevels",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                        ,0x13c,"Vec_Vec_t *Aig_ManLevelize(Aig_Man_t *)");
        }
        iVar2 = pVVar6->nSize;
        if (iVar2 <= (int)uVar16) {
          iVar1 = uVar16 + 1;
          if (pVVar6->nCap <= (int)uVar16) {
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar9 = (void **)malloc((ulong)(uint)(iVar1 * 8));
            }
            else {
              ppvVar9 = (void **)realloc(pVVar6->pArray,(ulong)(uint)(iVar1 * 8));
            }
            pVVar6->pArray = ppvVar9;
            pVVar6->nCap = iVar1;
          }
          lVar11 = 0;
          do {
            puVar8 = (undefined8 *)malloc(0x10);
            *puVar8 = 0;
            puVar8[1] = 0;
            ppvVar7[iVar2 + lVar11] = puVar8;
            lVar11 = lVar11 + 1;
          } while ((uVar16 - iVar2) + 1 != (int)lVar11);
          pVVar6->nSize = iVar1;
        }
        if (pVVar6->nSize <= (int)uVar16) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecVec.h"
                        ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
        }
        puVar4 = (uint *)ppvVar7[uVar13 & 0xffffff];
        uVar13 = *puVar4;
        if (puVar4[1] == uVar13) {
          if ((int)uVar13 < 0x10) {
            if (*(void **)(puVar4 + 2) == (void *)0x0) {
              pvVar10 = malloc(0x80);
            }
            else {
              pvVar10 = realloc(*(void **)(puVar4 + 2),0x80);
            }
            *(void **)(puVar4 + 2) = pvVar10;
            uVar16 = 0x10;
          }
          else {
            uVar16 = uVar13 * 2;
            if ((int)uVar16 <= (int)uVar13) goto LAB_006245e2;
            if (*(void **)(puVar4 + 2) == (void *)0x0) {
              pvVar10 = malloc((ulong)uVar13 << 4);
            }
            else {
              pvVar10 = realloc(*(void **)(puVar4 + 2),(ulong)uVar13 << 4);
            }
            *(void **)(puVar4 + 2) = pvVar10;
          }
          *puVar4 = uVar16;
        }
LAB_006245e2:
        uVar13 = puVar4[1];
        puVar4[1] = uVar13 + 1;
        *(void **)(*(long *)(puVar4 + 2) + (long)(int)uVar13 * 8) = pvVar3;
      }
      lVar5 = lVar5 + 1;
      pVVar12 = p->vObjs;
    } while (lVar5 < pVVar12->nSize);
  }
  return pVVar6;
}

Assistant:

Vec_Vec_t * Aig_ManLevelize( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    Vec_Vec_t * vLevels;
    int nLevels, i;
    nLevels = Aig_ManLevelNum( p );
    vLevels = Vec_VecStart( nLevels + 1 );
    Aig_ManForEachObj( p, pObj, i )
    {
        assert( (int)pObj->Level <= nLevels );
        Vec_VecPush( vLevels, pObj->Level, pObj );
    }
    return vLevels;
}